

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgregoriancalendar.cpp
# Opt level: O3

int QGregorianCalendar::yearStartWeekDay(int year)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = (-(year >> 0x1f) + year) - 0x321;
  iVar2 = -(year >> 0x1f) + year + ((int)uVar1 >> 2) + -0x321;
  if ((int)uVar1 < 0) {
    iVar2 = iVar2 + ~uVar1 / 100 + 1;
    uVar1 = ~(~uVar1 / 400);
  }
  else {
    iVar2 = iVar2 - uVar1 / 100;
    uVar1 = uVar1 / 400;
  }
  uVar1 = iVar2 + uVar1;
  if ((int)uVar1 < 0) {
    uVar1 = ((~uVar1 / 7) * 7 - ~uVar1) + 6;
  }
  else {
    uVar1 = uVar1 % 7;
  }
  return uVar1 + 1;
}

Assistant:

int QGregorianCalendar::yearStartWeekDay(int year)
{
    // Equivalent to weekDayOfJulian(julianForParts({year, 1, 1})
    const int y = year - (year < 0 ? 800 : 801);
    return qMod<7>(y + qDiv<4>(y) - qDiv<100>(y) + qDiv<400>(y)) + 1;
}